

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetAdaptivityAdjustment(void *arkode_mem,int adjust)

{
  undefined4 in_ESI;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               in_stack_ffffffffffffffe0,(ARKodeMem *)in_stack_ffffffffffffffd8,
                               (ARKodeHAdaptMem *)0x15c516);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x30,0x6ae,"ARKodeSetAdaptivityAdjustment",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else {
      *(undefined4 *)(in_stack_ffffffffffffffe0 + 100) = in_ESI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetAdaptivityAdjustment(void* arkode_mem, int adjust)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* store requested adjustment */
  hadapt_mem->adjust = adjust;
  return (ARK_SUCCESS);
}